

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O0

bool OpenSSLWrapper::GetCertInformation
               (X509 *cert,string *strCommonName,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *vstrAltNames)

{
  undefined8 __s;
  int iVar1;
  int iVar2;
  X509_NAME *a;
  char *pcVar3;
  stack_st_GENERAL_NAME *sk;
  OPENSSL_STACK *pOVar4;
  int *piVar5;
  uchar *__first;
  char *__serv;
  iterator iVar6;
  iterator iVar7;
  iterator iVar8;
  OPENSSL_sk_freefunc p_Var9;
  allocator<char> local_2b9;
  undefined1 local_2b8 [8];
  string strTmp_1;
  string local_290 [8];
  string servInfoClient;
  string local_268 [8];
  string caAddrClient;
  sockaddr_storage addr;
  int iStrLen;
  uint8_t *szIp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  char *local_158;
  char *local_148;
  char *local_140;
  char *local_138;
  allocator<char> local_129;
  undefined1 local_128 [8];
  string strTmp;
  uchar *utf8;
  GENERAL_NAME *entry;
  int i;
  int iCountNames;
  stack_st_GENERAL_NAME *pSubAltNames;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  char *local_88;
  char *local_78;
  char *local_70;
  char *local_68;
  ulong local_60;
  size_t nPos;
  allocator<char> local_41;
  string local_40 [8];
  string caBuf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *vstrAltNames_local;
  string *strCommonName_local;
  X509 *cert_local;
  
  caBuf.field_2._8_8_ = vstrAltNames;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,0x100,'\0',&local_41);
  std::allocator<char>::~allocator(&local_41);
  a = X509_get_subject_name((X509 *)cert);
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
  iVar1 = std::__cxx11::string::size();
  X509_NAME_oneline(a,pcVar3,iVar1);
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
  std::__cxx11::string::operator=((string *)strCommonName,pcVar3);
  local_60 = std::__cxx11::string::find((char *)strCommonName,0x17fa08);
  if (local_60 != 0xffffffffffffffff) {
    std::__cxx11::string::erase((ulong)strCommonName,0);
    local_60 = std::__cxx11::string::find((char *)strCommonName,0x17fa0d);
    if (local_60 != 0xffffffffffffffff) {
      std::__cxx11::string::erase((ulong)strCommonName,local_60);
    }
    local_68 = (char *)std::begin<std::__cxx11::string>(strCommonName);
    local_70 = (char *)std::end<std::__cxx11::string>(strCommonName);
    local_78 = (char *)std::begin<std::__cxx11::string>(strCommonName);
    local_88 = (char *)std::
                       transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,OpenSSLWrapper::GetCertInformation(x509_st_const*,std::__cxx11::string&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                                 (local_68,local_70,local_78);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)strCommonName);
    if ((*pcVar3 == '*') &&
       (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)strCommonName), *pcVar3 == '.')) {
      std::__cxx11::string::substr((ulong)&pSubAltNames,(ulong)strCommonName);
      std::operator+(&local_c8,"^(.+\\.)?",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &pSubAltNames);
      std::operator+(&local_a8,&local_c8,"$");
      std::__cxx11::string::operator=((string *)strCommonName,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&pSubAltNames);
    }
  }
  sk = (stack_st_GENERAL_NAME *)X509_get_ext_d2i((X509 *)cert,0x55,(int *)0x0,(int *)0x0);
  if (sk != (stack_st_GENERAL_NAME *)0x0) {
    pOVar4 = ossl_check_const_GENERAL_NAME_sk_type(sk);
    iVar1 = OPENSSL_sk_num(pOVar4);
    for (entry._0_4_ = 0; (int)entry < iVar1; entry._0_4_ = (int)entry + 1) {
      pOVar4 = ossl_check_const_GENERAL_NAME_sk_type(sk);
      piVar5 = (int *)OPENSSL_sk_value(pOVar4,(int)entry);
      if (piVar5 != (int *)0x0) {
        if (*piVar5 == 2) {
          strTmp.field_2._8_8_ = 0;
          ASN1_STRING_to_UTF8((uchar **)((long)&strTmp.field_2 + 8),*(ASN1_STRING **)(piVar5 + 2));
          __s = strTmp.field_2._8_8_;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_128,(char *)__s,&local_129);
          std::allocator<char>::~allocator(&local_129);
          local_138 = (char *)std::begin<std::__cxx11::string>
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_128);
          local_140 = (char *)std::end<std::__cxx11::string>
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_128);
          local_148 = (char *)std::begin<std::__cxx11::string>
                                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_128);
          local_158 = (char *)std::
                              transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,OpenSSLWrapper::GetCertInformation(x509_st_const*,std::__cxx11::string&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__1>
                                        (local_138,local_140,local_148);
          iVar2 = std::__cxx11::string::compare((string *)strCommonName);
          if (iVar2 != 0) {
            pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_128);
            if ((*pcVar3 == '*') &&
               (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_128), *pcVar3 == '.')
               ) {
              std::__cxx11::string::substr((ulong)&szIp,(ulong)local_128);
              std::operator+(&local_198,"^(.+\\.)?",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &szIp);
              std::operator+(&local_178,&local_198,"$");
              std::__cxx11::string::operator=((string *)local_128,(string *)&local_178);
              std::__cxx11::string::~string((string *)&local_178);
              std::__cxx11::string::~string((string *)&local_198);
              std::__cxx11::string::~string((string *)&szIp);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)caBuf.field_2._8_8_,(value_type *)local_128);
          }
          if (strTmp.field_2._8_8_ != 0) {
            CRYPTO_free((void *)strTmp.field_2._8_8_);
          }
          std::__cxx11::string::~string((string *)local_128);
        }
        else if (*piVar5 == 7) {
          __first = (uchar *)ASN1_STRING_get0_data(*(undefined8 *)(piVar5 + 2));
          addr.__ss_align._4_4_ = ASN1_STRING_length(*(ASN1_STRING **)(piVar5 + 2));
          if (__first != (uchar *)0x0) {
            caAddrClient.field_2._8_2_ = 2;
            if (addr.__ss_align._4_4_ < 5) {
              std::copy<unsigned_char_const*,unsigned_char*>
                        (__first,__first + addr.__ss_align._4_4_,
                         (uchar *)(caAddrClient.field_2._M_local_buf + 0xc));
            }
            else {
              caAddrClient.field_2._8_2_ = 10;
              std::copy<unsigned_char_const*,unsigned_char*>
                        (__first,__first + addr.__ss_align._4_4_,(uchar *)(addr.__ss_padding + 0x6e)
                        );
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_268,0x2f,'\0',
                       (allocator<char> *)(servInfoClient.field_2._M_local_buf + 0xf));
            std::allocator<char>::~allocator
                      ((allocator<char> *)(servInfoClient.field_2._M_local_buf + 0xf));
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (local_290,0x20,'\0',(allocator<char> *)(strTmp_1.field_2._M_local_buf + 0xf))
            ;
            std::allocator<char>::~allocator
                      ((allocator<char> *)(strTmp_1.field_2._M_local_buf + 0xf));
            pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_268);
            __serv = (char *)std::__cxx11::string::operator[]((ulong)local_290);
            iVar2 = getnameinfo((sockaddr *)((long)&caAddrClient.field_2 + 8),0x80,pcVar3,0x20,
                                __serv,0x20,3);
            if (iVar2 == 0) {
              pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_268);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_2b8,pcVar3,&local_2b9);
              std::allocator<char>::~allocator(&local_2b9);
              iVar6 = std::begin<std::__cxx11::string>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_2b8);
              iVar7 = std::end<std::__cxx11::string>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_2b8);
              iVar8 = std::begin<std::__cxx11::string>
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_2b8);
              std::
              transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,OpenSSLWrapper::GetCertInformation(x509_st_const*,std::__cxx11::string&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__2>
                        (iVar6._M_current,iVar7._M_current,iVar8._M_current);
              iVar2 = std::__cxx11::string::compare((string *)strCommonName);
              if (iVar2 != 0) {
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)caBuf.field_2._8_8_,(value_type *)local_2b8);
              }
              std::__cxx11::string::~string((string *)local_2b8);
            }
            std::__cxx11::string::~string(local_290);
            std::__cxx11::string::~string(local_268);
          }
        }
      }
    }
    pOVar4 = ossl_check_GENERAL_NAME_sk_type(sk);
    p_Var9 = ossl_check_GENERAL_NAME_freefunc_type(GENERAL_NAME_free);
    OPENSSL_sk_pop_free(pOVar4,p_Var9);
  }
  std::__cxx11::string::~string(local_40);
  return true;
}

Assistant:

bool GetCertInformation(const X509* cert, string& strCommonName, vector<string>& vstrAltNames)
    {
        string caBuf(256, 0);
        X509_NAME_oneline(X509_get_subject_name(cert), &caBuf[0], static_cast<int>(caBuf.size()));

        strCommonName = &caBuf[0];
        size_t nPos = strCommonName.find("/CN=");
        if (nPos != string::npos)
        {
            strCommonName.erase(0, nPos + 4);
            nPos = strCommonName.find("/");
            if (nPos != string::npos)
                strCommonName.erase(nPos, string::npos);
            transform(begin(strCommonName), end(strCommonName), begin(strCommonName), [](char c) noexcept { return static_cast<char>(::tolower(c)); });

            if (strCommonName[0] == '*' && strCommonName[1] == '.')
                strCommonName = "^(.+\\.)?" + strCommonName.substr(2) + "$";
        }

        STACK_OF(GENERAL_NAME)* pSubAltNames = static_cast<STACK_OF(GENERAL_NAME)*>(X509_get_ext_d2i(cert, NID_subject_alt_name, nullptr, nullptr));
        if (pSubAltNames != nullptr)
        {
            const int iCountNames = sk_GENERAL_NAME_num(pSubAltNames);
            for (int i = 0; i < iCountNames; ++i)
            {
                const GENERAL_NAME* entry = sk_GENERAL_NAME_value(pSubAltNames, i);
                if (!entry) continue;

                if (entry->type == GEN_DNS)
                {
                    unsigned char* utf8 = nullptr;
                    ASN1_STRING_to_UTF8(&utf8, entry->d.dNSName);

                    string strTmp(reinterpret_cast<char*>(utf8));
                    transform(begin(strTmp), end(strTmp), begin(strTmp), [](char c) noexcept { return static_cast<char>(::tolower(c)); });
                    if (strCommonName.compare(strTmp) != 0)
                    {
                        if (strTmp[0] == '*' && strTmp[1] == '.')
                            strTmp = "^(.+\\.)?" + strTmp.substr(2) + "$";
                        vstrAltNames.push_back(strTmp);
                    }
                    if (utf8)
                        OPENSSL_free(utf8);
                }
                else if (entry->type == GEN_IPADD)
                {
                    const uint8_t* szIp = ASN1_STRING_get0_data(entry->d.iPAddress);
                    const int iStrLen = ASN1_STRING_length(entry->d.iPAddress);
                    if (szIp != nullptr)
                    {
                        struct sockaddr_storage addr;
                        addr.ss_family = iStrLen > 4 ? AF_INET6 : AF_INET;
                        if (iStrLen > 4)
                            copy(&szIp[0], &szIp[iStrLen], reinterpret_cast<uint8_t*>(&addr.__ss_align));
                        else
                            copy(&szIp[0], &szIp[iStrLen], reinterpret_cast<uint8_t*>(&addr.ss_family) + 4);
                        string caAddrClient(INET6_ADDRSTRLEN + 1, 0);
                        string servInfoClient(NI_MAXSERV, 0);
                        if (::getnameinfo(reinterpret_cast<struct sockaddr*>(&addr), sizeof(struct sockaddr_storage), &caAddrClient[0], sizeof(caAddrClient), &servInfoClient[0], NI_MAXSERV, NI_NUMERICHOST | NI_NUMERICSERV) == 0)
                        {
                            string strTmp(&caAddrClient[0]);
                            transform(begin(strTmp), end(strTmp), begin(strTmp), [](char c) noexcept { return static_cast<char>(::tolower(c)); });
                            if (strCommonName.compare(strTmp) != 0)
                                vstrAltNames.push_back(strTmp);
                        }
                    }
                }
            }

            sk_GENERAL_NAME_pop_free(pSubAltNames, GENERAL_NAME_free);
        }

        return true;
    }